

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int PHF::init<unsigned_long,false>
              (phf *phf,unsigned_long *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  unsigned_long uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  byte bVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  uint uVar14;
  int iVar15;
  size_t __nmemb;
  size_t sVar16;
  undefined8 *__base;
  void *__ptr;
  uint32_t *puVar17;
  ulong uVar18;
  ulong uVar19;
  int *piVar20;
  uint uVar21;
  ulong uVar22;
  long *plVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  size_t __nmemb_00;
  size_t sVar28;
  undefined8 *puVar29;
  undefined8 *puVar30;
  undefined8 *puVar31;
  uint32_t uVar32;
  ulong uVar33;
  void *local_58;
  
  __nmemb_00 = n + (n == 0);
  uVar22 = l + (l == 0);
  sVar16 = 100;
  if (a < 100) {
    sVar16 = a;
  }
  phf->nodiv = false;
  __nmemb = phf_primeup(((__nmemb_00 + uVar22) - 1) / uVar22);
  sVar16 = phf_primeup((__nmemb_00 * 100) / (sVar16 + (sVar16 == 0)));
  if (sVar16 == 0 || __nmemb == 0) {
    return 0x22;
  }
  __base = (undefined8 *)calloc(__nmemb_00,0x18);
  if ((__base == (undefined8 *)0x0) || (local_58 = calloc(__nmemb,8), local_58 == (void *)0x0)) {
    __ptr = (void *)0x0;
    local_58 = (void *)0x0;
  }
  else {
    if (n != 0) {
      plVar23 = __base + 2;
      sVar28 = 0;
      do {
        uVar4 = k[sVar28];
        uVar14 = ((uint)((int)uVar4 * -0x3361d2af) >> 0x11 | (int)uVar4 * 0x16a88000) * 0x1b873593 ^
                 seed;
        iVar24 = (int)(uVar4 >> 0x20);
        uVar14 = ((uint)(iVar24 * -0x3361d2af) >> 0x11 | iVar24 * 0x16a88000) * 0x1b873593 ^
                 (uVar14 << 0xd | uVar14 >> 0x13) * 5 + 0xe6546b64;
        uVar14 = (uVar14 << 0xd | uVar14 >> 0x13) * 5 + 0xe6546b64;
        uVar14 = (uVar14 >> 0x10 ^ uVar14) * -0x7a143595;
        uVar14 = (uVar14 >> 0xd ^ uVar14) * -0x3d4d51cb;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = __nmemb;
        auVar10._4_8_ = 0;
        auVar10._0_4_ = uVar14 >> 0x10 ^ uVar14;
        lVar25 = SUB128(auVar10 % auVar5,0);
        plVar23[-2] = uVar4;
        *(int *)(plVar23 + -1) = SUB124(auVar10 % auVar5,0);
        plVar1 = (long *)((long)local_58 + lVar25 * 8);
        *plVar1 = *plVar1 + 1;
        *plVar23 = (long)((long)local_58 + lVar25 * 8);
        sVar28 = sVar28 + 1;
        plVar23 = plVar23 + 3;
      } while (n != sVar28);
    }
    qsort(__base,__nmemb_00,0x18,phf_keycmp<unsigned_long>);
    uVar22 = sVar16 + 0x3f >> 6;
    __ptr = calloc(uVar22 * 2,8);
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      puVar17 = (uint32_t *)calloc(__nmemb,4);
      if (puVar17 != (uint32_t *)0x0) {
        iVar24 = 0;
        if ((long)n < 1) {
          uVar19 = 0;
        }
        else {
          uVar19 = 0;
          puVar30 = __base;
          do {
            lVar25 = *(long *)puVar30[2];
            if (lVar25 == 0) break;
            puVar2 = puVar30 + lVar25 * 3;
            uVar33 = 1;
            while (uVar32 = (uint32_t)uVar33, 0 < lVar25) {
              uVar14 = (uVar32 * -0x3361d2af >> 0x11 | uVar32 * 0x16a88000) * 0x1b873593 ^ seed;
              uVar14 = (uVar14 << 0xd | uVar14 >> 0x13) * 5 + 0xe6546b64;
              puVar29 = puVar30;
              while( true ) {
                iVar15 = (int)*puVar29;
                uVar21 = ((uint)(iVar15 * -0x3361d2af) >> 0x11 | iVar15 * 0x16a88000) * 0x1b873593 ^
                         uVar14;
                iVar15 = (int)((ulong)*puVar29 >> 0x20);
                uVar21 = ((uint)(iVar15 * -0x3361d2af) >> 0x11 | iVar15 * 0x16a88000) * 0x1b873593 ^
                         (uVar21 << 0xd | uVar21 >> 0x13) * 5 + 0xe6546b64;
                uVar21 = (uVar21 << 0xd | uVar21 >> 0x13) * 5 + 0xe6546b64;
                uVar21 = (uVar21 >> 0x10 ^ uVar21) * -0x7a143595;
                uVar21 = (uVar21 >> 0xd ^ uVar21) * -0x3d4d51cb;
                auVar6._8_4_ = 0;
                auVar6._0_8_ = sVar16;
                auVar11._4_8_ = 0;
                auVar11._0_4_ = uVar21 >> 0x10 ^ uVar21;
                uVar26 = SUB128(auVar11 % auVar6,0);
                uVar18 = uVar26 >> 6 & 0x3ffffff;
                uVar27 = 1L << (SUB121(auVar11 % auVar6,0) & 0x3f);
                puVar31 = puVar30;
                if (((*(ulong *)((long)__ptr + uVar18 * 8) >> (uVar26 & 0x3f) & 1) != 0) ||
                   (uVar26 = *(ulong *)((long)__ptr + uVar18 * 8 + uVar22 * 8),
                   (uVar26 & uVar27) != 0)) break;
                *(ulong *)((long)__ptr + uVar18 * 8 + uVar22 * 8) = uVar26 | uVar27;
                puVar29 = puVar29 + 3;
                if (puVar2 <= puVar29) goto LAB_00133f79;
              }
              do {
                iVar15 = (int)*puVar31;
                uVar21 = ((uint)(iVar15 * -0x3361d2af) >> 0x11 | iVar15 * 0x16a88000) * 0x1b873593 ^
                         uVar14;
                iVar15 = (int)((ulong)*puVar31 >> 0x20);
                uVar21 = ((uint)(iVar15 * -0x3361d2af) >> 0x11 | iVar15 * 0x16a88000) * 0x1b873593 ^
                         (uVar21 << 0xd | uVar21 >> 0x13) * 5 + 0xe6546b64;
                uVar21 = (uVar21 << 0xd | uVar21 >> 0x13) * 5 + 0xe6546b64;
                uVar21 = (uVar21 >> 0x10 ^ uVar21) * -0x7a143595;
                uVar21 = (uVar21 >> 0xd ^ uVar21) * -0x3d4d51cb;
                auVar7._8_4_ = 0;
                auVar7._0_8_ = sVar16;
                auVar12._4_8_ = 0;
                auVar12._0_4_ = uVar21 >> 0x10 ^ uVar21;
                bVar9 = SUB121(auVar12 % auVar7,0) & 0x3f;
                puVar3 = (ulong *)((long)__ptr +
                                  (SUB128(auVar12 % auVar7,0) >> 6 & 0x3ffffff) * 8 + uVar22 * 8);
                *puVar3 = *puVar3 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
                puVar31 = puVar31 + 3;
              } while (puVar31 < puVar2);
              uVar33 = uVar33 + 1;
            }
LAB_00133f79:
            if (0 < lVar25) {
              uVar14 = (uVar32 * -0x3361d2af >> 0x11 | uVar32 * 0x16a88000) * 0x1b873593 ^ seed;
              puVar29 = puVar30;
              do {
                iVar15 = (int)*puVar29;
                uVar21 = ((uint)(iVar15 * -0x3361d2af) >> 0x11 | iVar15 * 0x16a88000) * 0x1b873593 ^
                         (uVar14 << 0xd | uVar14 >> 0x13) * 5 + 0xe6546b64;
                iVar15 = (int)((ulong)*puVar29 >> 0x20);
                uVar21 = ((uint)(iVar15 * -0x3361d2af) >> 0x11 | iVar15 * 0x16a88000) * 0x1b873593 ^
                         (uVar21 << 0xd | uVar21 >> 0x13) * 5 + 0xe6546b64;
                uVar21 = (uVar21 << 0xd | uVar21 >> 0x13) * 5 + 0xe6546b64;
                uVar21 = (uVar21 >> 0x10 ^ uVar21) * -0x7a143595;
                uVar21 = (uVar21 >> 0xd ^ uVar21) * -0x3d4d51cb;
                auVar8._8_4_ = 0;
                auVar8._0_8_ = sVar16;
                auVar13._4_8_ = 0;
                auVar13._0_4_ = uVar21 >> 0x10 ^ uVar21;
                puVar3 = (ulong *)((long)__ptr + (SUB128(auVar13 % auVar8,0) >> 6 & 0x3ffffff) * 8);
                *puVar3 = *puVar3 | 1L << (SUB121(auVar13 % auVar8,0) & 0x3f);
                puVar29 = puVar29 + 3;
              } while (puVar29 < puVar2);
            }
            uVar19 = uVar19 & 0xffffffff;
            if (uVar19 < uVar33) {
              uVar19 = uVar33;
            }
            puVar17[*(uint *)(puVar30 + 1)] = uVar32;
            puVar30 = puVar2;
          } while (puVar2 < __base + n * 3);
          uVar19 = uVar19 & 0xffffffff;
        }
        phf->seed = seed;
        phf->r = __nmemb;
        phf->m = sVar16;
        phf->g = puVar17;
        phf->d_max = uVar19;
        phf->g_op = PHF_G_UINT32_MOD_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_0013407c;
      }
    }
  }
  piVar20 = __errno_location();
  iVar24 = *piVar20;
LAB_0013407c:
  free(__ptr);
  free(local_58);
  free(__base);
  return iVar24;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}